

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_db.c
# Opt level: O0

const_strarray *
cfg_db_get_schema_entry_value(cfg_named_section *section,cfg_schema_entry *schema_entry)

{
  const_strarray *value;
  cfg_schema_entry *schema_entry_local;
  cfg_named_section *section_local;
  
  if ((section == (cfg_named_section *)0x0) ||
     (section_local =
           (cfg_named_section *)
           cfg_db_get_entry_value
                     (section->section_type->db,section->section_type->type,section->name,
                      (schema_entry->key).entry), section_local == (cfg_named_section *)0x0)) {
    section_local = (cfg_named_section *)&schema_entry->def;
  }
  return (const_strarray *)section_local;
}

Assistant:

const struct const_strarray *
cfg_db_get_schema_entry_value(const struct cfg_named_section *section, const struct cfg_schema_entry *schema_entry) {
  const struct const_strarray *value;

  if (section) {
    value = cfg_db_get_entry_value(
      section->section_type->db, section->section_type->type, section->name, schema_entry->key.entry);
    if (value) {
      return value;
    }
  }

  return &schema_entry->def;
}